

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
::prepare_insert(raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
                 *this,size_t hashval)

{
  ulong uVar1;
  size_t sVar2;
  unsigned_long uVar3;
  ctrl_t *pcVar4;
  FindInfo FVar5;
  
  FVar5 = find_first_non_full(this,hashval);
  sVar2 = FVar5.offset;
  pcVar4 = this->ctrl_;
  uVar3 = (this->settings_).
          super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
          .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  if (uVar3 != 0) goto LAB_001222be;
  if (pcVar4[sVar2] == -2) {
    uVar3 = 0;
    goto LAB_001222be;
  }
  if (this->capacity_ == 0) {
    sVar2 = 1;
LAB_00122304:
    resize(this,sVar2);
  }
  else {
    uVar1 = this->size_;
    sVar2 = CapacityToGrowth(this->capacity_);
    if (sVar2 >> 1 < uVar1) {
      sVar2 = this->capacity_ * 2 + 1;
      goto LAB_00122304;
    }
    drop_deletes_without_resize(this);
  }
  FVar5 = find_first_non_full(this,hashval);
  sVar2 = FVar5.offset;
  pcVar4 = this->ctrl_;
  uVar3 = (this->settings_).
          super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
          .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
LAB_001222be:
  this->size_ = this->size_ + 1;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar3 - (pcVar4[sVar2] == -0x80);
  return sVar2;
}

Assistant:

size_t prepare_insert(size_t hashval) PHMAP_ATTRIBUTE_NOINLINE {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                rehash_and_grow_if_necessary();
        }
        FindInfo target = find_first_non_full(hashval);
        if (PHMAP_PREDICT_FALSE(growth_left() == 0 &&
                               !IsDeleted(ctrl_[target.offset]))) {
            rehash_and_grow_if_necessary();
            target = find_first_non_full(hashval);
        }
        ++size_;
        growth_left() -= IsEmpty(ctrl_[target.offset]);
        // set_ctrl(target.offset, H2(hashval));
        infoz_.RecordInsert(hashval, target.probe_length);
        return target.offset;
    }